

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

void uiter_setUTF16BE_63(UCharIterator *iter,char *s,int32_t length)

{
  int32_t iVar1;
  int32_t length_local;
  char *s_local;
  UCharIterator *iter_local;
  
  if (iter != (UCharIterator *)0x0) {
    if ((s == (char *)0x0) || ((length != -1 && ((length < 0 || ((length & 1U) != 0)))))) {
      memcpy(iter,&noopIterator,0x70);
    }
    else {
      memcpy(iter,&utf16BEIterator,0x70);
      iter->context = s;
      if (length >> 1 < 0) {
        iVar1 = utf16BE_strlen(s);
        iter->length = iVar1;
      }
      else {
        iter->length = length >> 1;
      }
      iter->limit = iter->length;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uiter_setUTF16BE(UCharIterator *iter, const char *s, int32_t length) {
    if(iter!=NULL) {
        /* allow only even-length strings (the input length counts bytes) */
        if(s!=NULL && (length==-1 || (length>=0 && IS_EVEN(length)))) {
            /* length/=2, except that >>=1 also works for -1 (-1/2==0, -1>>1==-1) */
            length>>=1;

            if(U_IS_BIG_ENDIAN && IS_POINTER_EVEN(s)) {
                /* big-endian machine and 2-aligned UTF-16BE string: use normal UChar iterator */
                uiter_setString(iter, (const UChar *)s, length);
                return;
            }

            *iter=utf16BEIterator;
            iter->context=s;
            if(length>=0) {
                iter->length=length;
            } else {
                iter->length=utf16BE_strlen(s);
            }
            iter->limit=iter->length;
        } else {
            *iter=noopIterator;
        }
    }
}